

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPluginAPI.cxx
# Opt level: O2

int cmExecuteCommand(void *arg,char *name,int numArgs,char **args)

{
  ulong uVar1;
  bool bVar2;
  cmExecutionStatus status;
  cmListFileFunction lff;
  int local_d4;
  cmMakefile *local_d0;
  string local_c8;
  undefined1 local_a8 [96];
  pointer local_48;
  pointer pcStack_40;
  pointer local_38;
  
  local_a8._0_8_ = local_a8 + 0x10;
  local_a8._8_8_ = 0;
  local_a8[0x10] = '\0';
  local_a8._32_8_ = local_a8 + 0x30;
  local_a8._40_8_ = 0;
  local_a8[0x30] = '\0';
  local_a8._64_8_ = 0;
  local_a8._72_8_ = 0;
  local_a8._80_8_ = 0;
  local_a8._88_8_ = 0;
  local_48 = (pointer)0x0;
  pcStack_40 = (pointer)0x0;
  local_38 = (pointer)0x0;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_c8,name,(allocator<char> *)&local_d4);
  local_d0 = (cmMakefile *)arg;
  cmCommandContext::cmCommandName::operator=((cmCommandName *)local_a8,&local_c8);
  std::__cxx11::string::~string((string *)&local_c8);
  uVar1 = 0;
  if (0 < numArgs) {
    uVar1 = (ulong)(uint)numArgs;
  }
  while (bVar2 = uVar1 != 0, uVar1 = uVar1 - 1, bVar2) {
    local_c8._M_dataplus._M_p._0_4_ = 1;
    local_d4 = 0;
    std::vector<cmListFileArgument,std::allocator<cmListFileArgument>>::
    emplace_back<char_const*&,cmListFileArgument::Delimiter,int>
              ((vector<cmListFileArgument,std::allocator<cmListFileArgument>> *)&local_48,args,
               (Delimiter *)&local_c8,&local_d4);
    args = args + 1;
  }
  local_c8._M_dataplus._M_p._0_4_ = 0;
  bVar2 = cmMakefile::ExecuteCommand
                    (local_d0,(cmListFileFunction *)local_a8,(cmExecutionStatus *)&local_c8);
  cmListFileFunction::~cmListFileFunction((cmListFileFunction *)local_a8);
  return (uint)bVar2;
}

Assistant:

int CCONV cmExecuteCommand(void* arg, const char* name, int numArgs,
                           const char** args)
{
  cmMakefile* mf = static_cast<cmMakefile*>(arg);
  cmListFileFunction lff;
  lff.Name = name;
  for (int i = 0; i < numArgs; ++i) {
    // Assume all arguments are quoted.
    lff.Arguments.emplace_back(args[i], cmListFileArgument::Quoted, 0);
  }
  cmExecutionStatus status;
  return mf->ExecuteCommand(lff, status);
}